

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

void __thiscall
jbcoin::STObject::
setFieldUsingSetValue<jbcoin::STAccount,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
          (STObject *this,SField *field,base_uint<160UL,_jbcoin::detail::AccountIDTag> value)

{
  int iVar1;
  STBase *pSVar2;
  
  pSVar2 = getPField(this,field,true);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
  if (iVar1 == 0) {
    pSVar2 = makeFieldPresent(this,field);
    if (pSVar2 == (STBase *)0x0) goto LAB_001fce0b;
  }
  if (pSVar2->_vptr_STBase == (_func_int **)&PTR__STBase_002f7f40) {
    *(uint32_t *)&pSVar2[2]._vptr_STBase = value.pn[4];
    pSVar2[1]._vptr_STBase = (_func_int **)value.pn._0_8_;
    pSVar2[1].fName = (SField *)value.pn._8_8_;
    *(undefined1 *)((long)&pSVar2[2]._vptr_STBase + 4) = 0;
    return;
  }
LAB_001fce0b:
  Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
}

Assistant:

void setFieldUsingSetValue (SField const& field, V value)
    {
        static_assert(!std::is_lvalue_reference<V>::value, "");

        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        cf->setValue (std::move (value));
    }